

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ion_master_table.c
# Opt level: O2

ion_err_t ion_init_master_table(void)

{
  ion_err_t iVar1;
  ion_dictionary_config_info_t master_config;
  
  if (ion_master_table_file == (FILE *)0x0) {
    ion_master_table_file = (FILE *)fopen("ion_mt.tbl","r+b");
    if ((FILE *)ion_master_table_file == (FILE *)0x0) {
      ion_master_table_file = (FILE *)fopen("ion_mt.tbl","w+b");
      if ((FILE *)ion_master_table_file == (FILE *)0x0) {
        return '\t';
      }
      ion_master_table_next_id = 1;
      master_config.dictionary_size = 0;
      master_config.dictionary_type = dictionary_type_bpp_tree_t;
      master_config.dictionary_status = '\0';
      master_config._29_3_ = 0;
      master_config.use_type = '\0';
      master_config._5_3_ = 0;
      master_config.type = key_type_numeric_signed;
      master_config.key_size = 0;
      master_config.value_size = 0;
      master_config.id = ion_master_table_next_id;
      iVar1 = ion_master_table_write(&master_config,0);
      if (iVar1 != '\0') {
        return iVar1;
      }
    }
    else {
      iVar1 = ion_master_table_read(&master_config,0);
      if (iVar1 != '\0') {
        return '\b';
      }
      ion_master_table_next_id = master_config.id;
    }
  }
  return '\0';
}

Assistant:

ion_err_t
ion_init_master_table(
	void
) {
	ion_err_t error = err_ok;

	/* If it's already open, then we don't do anything. */
	if (NULL != ion_master_table_file) {
		return err_ok;
	}

	ion_master_table_file = fopen(ION_MASTER_TABLE_FILENAME, "r+b");

	/* File may not exist. */
	if (NULL == ion_master_table_file) {
		ion_master_table_file = fopen(ION_MASTER_TABLE_FILENAME, "w+b");

		if (NULL == ion_master_table_file) {
			return err_file_open_error;
		}

		/* Clean fresh file was opened. */
		ion_master_table_next_id = 1;

		/* Write master row. */
		ion_dictionary_config_info_t master_config = { .id = ion_master_table_next_id };

		if (err_ok != (error = ion_master_table_write(&master_config, 0))) {
			return error;
		}
	}
	else {
		/* Here we read an existing file. */

		/* Find existing ID count. */
		ion_dictionary_config_info_t master_config;

		if (ion_master_table_read(&master_config, 0)) {
			return err_file_read_error;
		}

		ion_master_table_next_id = master_config.id;
	}

	return err_ok;
}